

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

bool __thiscall S2Polygon::FindValidationError(S2Polygon *this,S2Error *error)

{
  undefined4 uVar1;
  S2Error *this_00;
  bool bVar2;
  int iVar3;
  Code code;
  S2Loop *pSVar4;
  undefined8 uVar5;
  S2Error local_48;
  S2Error *pSStack_20;
  int i;
  S2Error *error_local;
  S2Polygon *this_local;
  
  local_48._36_4_ = 0;
  pSStack_20 = error;
  error_local = (S2Error *)this;
  while( true ) {
    uVar1 = local_48._36_4_;
    iVar3 = num_loops(this);
    if (iVar3 <= (int)uVar1) {
      bVar2 = s2shapeutil::FindSelfIntersection(&(this->index_).super_S2ShapeIndex,pSStack_20);
      if (bVar2) {
        this_local._7_1_ = true;
      }
      else if (this->error_inconsistent_loop_orientations_ == '\0') {
        this_local._7_1_ = FindLoopNestingError(this,pSStack_20);
      }
      else {
        S2Error::Init(pSStack_20,POLYGON_INCONSISTENT_LOOP_ORIENTATIONS,
                      "Inconsistent loop orientations detected");
        this_local._7_1_ = true;
      }
      return this_local._7_1_;
    }
    pSVar4 = loop(this,local_48._36_4_);
    bVar2 = S2Loop::FindValidationErrorNoIndex(pSVar4,pSStack_20);
    this_00 = pSStack_20;
    if (bVar2) {
      code = S2Error::code(pSStack_20);
      uVar1 = local_48._36_4_;
      S2Error::text_abi_cxx11_(&local_48);
      uVar5 = std::__cxx11::string::c_str();
      S2Error::Init(this_00,code,"Loop %d: %s",(ulong)(uint)uVar1,uVar5);
      std::__cxx11::string::~string((string *)&local_48);
      return true;
    }
    pSVar4 = loop(this,local_48._36_4_);
    bVar2 = S2Loop::is_empty(pSVar4);
    if (bVar2) {
      S2Error::Init(pSStack_20,POLYGON_EMPTY_LOOP,"Loop %d: empty loops are not allowed",
                    (ulong)(uint)local_48._36_4_);
      return true;
    }
    pSVar4 = loop(this,local_48._36_4_);
    bVar2 = S2Loop::is_full(pSVar4);
    if ((bVar2) && (iVar3 = num_loops(this), 1 < iVar3)) break;
    local_48._36_4_ = local_48._36_4_ + 1;
  }
  S2Error::Init(pSStack_20,POLYGON_EXCESS_FULL_LOOP,"Loop %d: full loop appears in non-full polygon"
                ,(ulong)(uint)local_48._36_4_);
  return true;
}

Assistant:

bool S2Polygon::FindValidationError(S2Error* error) const {
  for (int i = 0; i < num_loops(); ++i) {
    // Check for loop errors that don't require building an S2ShapeIndex.
    if (loop(i)->FindValidationErrorNoIndex(error)) {
      error->Init(error->code(),
                  "Loop %d: %s", i, error->text().c_str());
      return true;
    }
    // Check that no loop is empty, and that the full loop only appears in the
    // full polygon.
    if (loop(i)->is_empty()) {
      error->Init(S2Error::POLYGON_EMPTY_LOOP,
                  "Loop %d: empty loops are not allowed", i);
      return true;
    }
    if (loop(i)->is_full() && num_loops() > 1) {
      error->Init(S2Error::POLYGON_EXCESS_FULL_LOOP,
                  "Loop %d: full loop appears in non-full polygon", i);
      return true;
    }
  }

  // Check for loop self-intersections and loop pairs that cross
  // (including duplicate edges and vertices).
  if (s2shapeutil::FindSelfIntersection(index_, error)) return true;

  // Check whether InitOriented detected inconsistent loop orientations.
  if (error_inconsistent_loop_orientations_) {
    error->Init(S2Error::POLYGON_INCONSISTENT_LOOP_ORIENTATIONS,
                "Inconsistent loop orientations detected");
    return true;
  }

  // Finally, verify the loop nesting hierarchy.
  return FindLoopNestingError(error);
}